

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_setup_mct_encoding(opj_tcp_t *p_tcp,opj_image_t *p_image)

{
  OPJ_UINT32 OVar1;
  uint uVar2;
  opj_mct_data_t *poVar3;
  OPJ_BYTE *pOVar4;
  opj_tccp_t *ptr;
  opj_simple_mcc_decorrelation_data_t *poVar5;
  opj_simple_mcc_decorrelation_data_t *new_mcc_records;
  opj_mct_data_t *new_mct_records_1;
  opj_mct_data_t *new_mct_records;
  opj_tccp_t *l_tccp;
  OPJ_FLOAT32 *l_current_data;
  OPJ_FLOAT32 *l_data;
  OPJ_UINT32 l_nb_elem;
  OPJ_UINT32 l_mct_size;
  opj_simple_mcc_decorrelation_data_t *l_mcc_data;
  opj_mct_data_t *l_mct_offset_data;
  opj_mct_data_t *l_mct_deco_data;
  OPJ_UINT32 l_indix;
  OPJ_UINT32 i;
  opj_image_t *p_image_local;
  opj_tcp_t *p_tcp_local;
  
  l_mct_deco_data._0_4_ = 1;
  l_mct_offset_data = (opj_mct_data_t *)0x0;
  if (p_tcp == (opj_tcp_t *)0x0) {
    __assert_fail("p_tcp != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x1dd8,"OPJ_BOOL opj_j2k_setup_mct_encoding(opj_tcp_t *, opj_image_t *)");
  }
  if (p_tcp->mct == 2) {
    if (p_tcp->m_mct_decoding_matrix != (OPJ_FLOAT32 *)0x0) {
      if (p_tcp->m_nb_mct_records == p_tcp->m_nb_max_mct_records) {
        p_tcp->m_nb_max_mct_records = p_tcp->m_nb_max_mct_records + 10;
        poVar3 = (opj_mct_data_t *)
                 opj_realloc(p_tcp->m_mct_records,(ulong)p_tcp->m_nb_max_mct_records << 5);
        if (poVar3 == (opj_mct_data_t *)0x0) {
          opj_free(p_tcp->m_mct_records);
          p_tcp->m_mct_records = (opj_mct_data_t *)0x0;
          p_tcp->m_nb_max_mct_records = 0;
          p_tcp->m_nb_mct_records = 0;
          return 0;
        }
        p_tcp->m_mct_records = poVar3;
        memset(p_tcp->m_mct_records + p_tcp->m_nb_mct_records,0,
               (ulong)(p_tcp->m_nb_max_mct_records - p_tcp->m_nb_mct_records) << 5);
      }
      l_mct_offset_data = p_tcp->m_mct_records + p_tcp->m_nb_mct_records;
      if (l_mct_offset_data->m_data != (OPJ_BYTE *)0x0) {
        opj_free(l_mct_offset_data->m_data);
        l_mct_offset_data->m_data = (OPJ_BYTE *)0x0;
      }
      l_mct_deco_data._0_4_ = 2;
      l_mct_offset_data->m_index = 1;
      l_mct_offset_data->m_array_type = MCT_TYPE_DECORRELATION;
      l_mct_offset_data->m_element_type = MCT_TYPE_FLOAT;
      OVar1 = p_image->numcomps * p_image->numcomps;
      uVar2 = OVar1 * MCT_ELEMENT_SIZE[l_mct_offset_data->m_element_type];
      pOVar4 = (OPJ_BYTE *)opj_malloc((ulong)uVar2);
      l_mct_offset_data->m_data = pOVar4;
      if (l_mct_offset_data->m_data == (OPJ_BYTE *)0x0) {
        return 0;
      }
      (*j2k_mct_write_functions_from_float[l_mct_offset_data->m_element_type])
                (p_tcp->m_mct_decoding_matrix,l_mct_offset_data->m_data,OVar1);
      l_mct_offset_data->m_data_size = uVar2;
      p_tcp->m_nb_mct_records = p_tcp->m_nb_mct_records + 1;
    }
    if (p_tcp->m_nb_mct_records == p_tcp->m_nb_max_mct_records) {
      p_tcp->m_nb_max_mct_records = p_tcp->m_nb_max_mct_records + 10;
      poVar3 = (opj_mct_data_t *)
               opj_realloc(p_tcp->m_mct_records,(ulong)p_tcp->m_nb_max_mct_records << 5);
      if (poVar3 == (opj_mct_data_t *)0x0) {
        opj_free(p_tcp->m_mct_records);
        p_tcp->m_mct_records = (opj_mct_data_t *)0x0;
        p_tcp->m_nb_max_mct_records = 0;
        p_tcp->m_nb_mct_records = 0;
        return 0;
      }
      p_tcp->m_mct_records = poVar3;
      poVar3 = p_tcp->m_mct_records;
      uVar2 = p_tcp->m_nb_mct_records;
      memset(poVar3 + uVar2,0,(ulong)(p_tcp->m_nb_max_mct_records - p_tcp->m_nb_mct_records) << 5);
      if (l_mct_offset_data != (opj_mct_data_t *)0x0) {
        l_mct_offset_data = poVar3 + uVar2 + -1;
      }
    }
    poVar3 = p_tcp->m_mct_records + p_tcp->m_nb_mct_records;
    if (poVar3->m_data != (OPJ_BYTE *)0x0) {
      opj_free(poVar3->m_data);
      poVar3->m_data = (OPJ_BYTE *)0x0;
    }
    poVar3->m_index = (OPJ_UINT32)l_mct_deco_data;
    poVar3->m_array_type = MCT_TYPE_OFFSET;
    poVar3->m_element_type = MCT_TYPE_FLOAT;
    uVar2 = p_image->numcomps;
    OVar1 = MCT_ELEMENT_SIZE[poVar3->m_element_type];
    pOVar4 = (OPJ_BYTE *)opj_malloc((ulong)(uVar2 * OVar1));
    poVar3->m_data = pOVar4;
    if (poVar3->m_data == (OPJ_BYTE *)0x0) {
      p_tcp_local._4_4_ = 0;
    }
    else {
      ptr = (opj_tccp_t *)opj_malloc((ulong)uVar2 << 2);
      if (ptr == (opj_tccp_t *)0x0) {
        opj_free(poVar3->m_data);
        poVar3->m_data = (OPJ_BYTE *)0x0;
        p_tcp_local._4_4_ = 0;
      }
      else {
        new_mct_records = (opj_mct_data_t *)p_tcp->tccps;
        l_tccp = ptr;
        for (l_mct_deco_data._4_4_ = 0; l_mct_deco_data._4_4_ < uVar2;
            l_mct_deco_data._4_4_ = l_mct_deco_data._4_4_ + 1) {
          l_tccp->csty = (OPJ_UINT32)(float)*(int *)((long)&new_mct_records[0x21].m_data + 4);
          new_mct_records = (opj_mct_data_t *)&new_mct_records[0x21].m_data_size;
          l_tccp = (opj_tccp_t *)&l_tccp->numresolutions;
        }
        (*j2k_mct_write_functions_from_float[poVar3->m_element_type])(ptr,poVar3->m_data,uVar2);
        opj_free(ptr);
        poVar3->m_data_size = uVar2 * OVar1;
        p_tcp->m_nb_mct_records = p_tcp->m_nb_mct_records + 1;
        if (p_tcp->m_nb_mcc_records == p_tcp->m_nb_max_mcc_records) {
          p_tcp->m_nb_max_mcc_records = p_tcp->m_nb_max_mcc_records + 10;
          poVar5 = (opj_simple_mcc_decorrelation_data_t *)
                   opj_realloc(p_tcp->m_mcc_records,(ulong)p_tcp->m_nb_max_mcc_records << 5);
          if (poVar5 == (opj_simple_mcc_decorrelation_data_t *)0x0) {
            opj_free(p_tcp->m_mcc_records);
            p_tcp->m_mcc_records = (opj_simple_mcc_decorrelation_data_t *)0x0;
            p_tcp->m_nb_max_mcc_records = 0;
            p_tcp->m_nb_mcc_records = 0;
            return 0;
          }
          p_tcp->m_mcc_records = poVar5;
          memset(p_tcp->m_mcc_records + p_tcp->m_nb_mcc_records,0,
                 (ulong)(p_tcp->m_nb_max_mcc_records - p_tcp->m_nb_mcc_records) << 5);
        }
        poVar5 = p_tcp->m_mcc_records + p_tcp->m_nb_mcc_records;
        poVar5->m_decorrelation_array = l_mct_offset_data;
        poVar5->field_0x18 = poVar5->field_0x18 & 0xfe | 1;
        poVar5->m_nb_comps = p_image->numcomps;
        poVar5->m_index = (OPJ_UINT32)l_mct_deco_data + 1;
        poVar5->m_offset_array = poVar3;
        p_tcp->m_nb_mcc_records = p_tcp->m_nb_mcc_records + 1;
        p_tcp_local._4_4_ = 1;
      }
    }
  }
  else {
    p_tcp_local._4_4_ = 1;
  }
  return p_tcp_local._4_4_;
}

Assistant:

OPJ_BOOL opj_j2k_setup_mct_encoding(opj_tcp_t * p_tcp, opj_image_t * p_image)
{
    OPJ_UINT32 i;
    OPJ_UINT32 l_indix = 1;
    opj_mct_data_t * l_mct_deco_data = 00, * l_mct_offset_data = 00;
    opj_simple_mcc_decorrelation_data_t * l_mcc_data;
    OPJ_UINT32 l_mct_size, l_nb_elem;
    OPJ_FLOAT32 * l_data, * l_current_data;
    opj_tccp_t * l_tccp;

    /* preconditions */
    assert(p_tcp != 00);

    if (p_tcp->mct != 2) {
        return OPJ_TRUE;
    }

    if (p_tcp->m_mct_decoding_matrix) {
        if (p_tcp->m_nb_mct_records == p_tcp->m_nb_max_mct_records) {
            opj_mct_data_t *new_mct_records;
            p_tcp->m_nb_max_mct_records += OPJ_J2K_MCT_DEFAULT_NB_RECORDS;

            new_mct_records = (opj_mct_data_t *) opj_realloc(p_tcp->m_mct_records,
                              p_tcp->m_nb_max_mct_records * sizeof(opj_mct_data_t));
            if (! new_mct_records) {
                opj_free(p_tcp->m_mct_records);
                p_tcp->m_mct_records = NULL;
                p_tcp->m_nb_max_mct_records = 0;
                p_tcp->m_nb_mct_records = 0;
                /* opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to setup mct encoding\n"); */
                return OPJ_FALSE;
            }
            p_tcp->m_mct_records = new_mct_records;
            l_mct_deco_data = p_tcp->m_mct_records + p_tcp->m_nb_mct_records;

            memset(l_mct_deco_data, 0,
                   (p_tcp->m_nb_max_mct_records - p_tcp->m_nb_mct_records) * sizeof(
                       opj_mct_data_t));
        }
        l_mct_deco_data = p_tcp->m_mct_records + p_tcp->m_nb_mct_records;

        if (l_mct_deco_data->m_data) {
            opj_free(l_mct_deco_data->m_data);
            l_mct_deco_data->m_data = 00;
        }

        l_mct_deco_data->m_index = l_indix++;
        l_mct_deco_data->m_array_type = MCT_TYPE_DECORRELATION;
        l_mct_deco_data->m_element_type = MCT_TYPE_FLOAT;
        l_nb_elem = p_image->numcomps * p_image->numcomps;
        l_mct_size = l_nb_elem * MCT_ELEMENT_SIZE[l_mct_deco_data->m_element_type];
        l_mct_deco_data->m_data = (OPJ_BYTE*)opj_malloc(l_mct_size);

        if (! l_mct_deco_data->m_data) {
            return OPJ_FALSE;
        }

        j2k_mct_write_functions_from_float[l_mct_deco_data->m_element_type](
            p_tcp->m_mct_decoding_matrix, l_mct_deco_data->m_data, l_nb_elem);

        l_mct_deco_data->m_data_size = l_mct_size;
        ++p_tcp->m_nb_mct_records;
    }

    if (p_tcp->m_nb_mct_records == p_tcp->m_nb_max_mct_records) {
        opj_mct_data_t *new_mct_records;
        p_tcp->m_nb_max_mct_records += OPJ_J2K_MCT_DEFAULT_NB_RECORDS;
        new_mct_records = (opj_mct_data_t *) opj_realloc(p_tcp->m_mct_records,
                          p_tcp->m_nb_max_mct_records * sizeof(opj_mct_data_t));
        if (! new_mct_records) {
            opj_free(p_tcp->m_mct_records);
            p_tcp->m_mct_records = NULL;
            p_tcp->m_nb_max_mct_records = 0;
            p_tcp->m_nb_mct_records = 0;
            /* opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to setup mct encoding\n"); */
            return OPJ_FALSE;
        }
        p_tcp->m_mct_records = new_mct_records;
        l_mct_offset_data = p_tcp->m_mct_records + p_tcp->m_nb_mct_records;

        memset(l_mct_offset_data, 0,
               (p_tcp->m_nb_max_mct_records - p_tcp->m_nb_mct_records) * sizeof(
                   opj_mct_data_t));

        if (l_mct_deco_data) {
            l_mct_deco_data = l_mct_offset_data - 1;
        }
    }

    l_mct_offset_data = p_tcp->m_mct_records + p_tcp->m_nb_mct_records;

    if (l_mct_offset_data->m_data) {
        opj_free(l_mct_offset_data->m_data);
        l_mct_offset_data->m_data = 00;
    }

    l_mct_offset_data->m_index = l_indix++;
    l_mct_offset_data->m_array_type = MCT_TYPE_OFFSET;
    l_mct_offset_data->m_element_type = MCT_TYPE_FLOAT;
    l_nb_elem = p_image->numcomps;
    l_mct_size = l_nb_elem * MCT_ELEMENT_SIZE[l_mct_offset_data->m_element_type];
    l_mct_offset_data->m_data = (OPJ_BYTE*)opj_malloc(l_mct_size);

    if (! l_mct_offset_data->m_data) {
        return OPJ_FALSE;
    }

    l_data = (OPJ_FLOAT32*)opj_malloc(l_nb_elem * sizeof(OPJ_FLOAT32));
    if (! l_data) {
        opj_free(l_mct_offset_data->m_data);
        l_mct_offset_data->m_data = 00;
        return OPJ_FALSE;
    }

    l_tccp = p_tcp->tccps;
    l_current_data = l_data;

    for (i = 0; i < l_nb_elem; ++i) {
        *(l_current_data++) = (OPJ_FLOAT32)(l_tccp->m_dc_level_shift);
        ++l_tccp;
    }

    j2k_mct_write_functions_from_float[l_mct_offset_data->m_element_type](l_data,
            l_mct_offset_data->m_data, l_nb_elem);

    opj_free(l_data);

    l_mct_offset_data->m_data_size = l_mct_size;

    ++p_tcp->m_nb_mct_records;

    if (p_tcp->m_nb_mcc_records == p_tcp->m_nb_max_mcc_records) {
        opj_simple_mcc_decorrelation_data_t *new_mcc_records;
        p_tcp->m_nb_max_mcc_records += OPJ_J2K_MCT_DEFAULT_NB_RECORDS;
        new_mcc_records = (opj_simple_mcc_decorrelation_data_t *) opj_realloc(
                              p_tcp->m_mcc_records, p_tcp->m_nb_max_mcc_records * sizeof(
                                  opj_simple_mcc_decorrelation_data_t));
        if (! new_mcc_records) {
            opj_free(p_tcp->m_mcc_records);
            p_tcp->m_mcc_records = NULL;
            p_tcp->m_nb_max_mcc_records = 0;
            p_tcp->m_nb_mcc_records = 0;
            /* opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to setup mct encoding\n"); */
            return OPJ_FALSE;
        }
        p_tcp->m_mcc_records = new_mcc_records;
        l_mcc_data = p_tcp->m_mcc_records + p_tcp->m_nb_mcc_records;
        memset(l_mcc_data, 0, (p_tcp->m_nb_max_mcc_records - p_tcp->m_nb_mcc_records) *
               sizeof(opj_simple_mcc_decorrelation_data_t));

    }

    l_mcc_data = p_tcp->m_mcc_records + p_tcp->m_nb_mcc_records;
    l_mcc_data->m_decorrelation_array = l_mct_deco_data;
    l_mcc_data->m_is_irreversible = 1;
    l_mcc_data->m_nb_comps = p_image->numcomps;
    l_mcc_data->m_index = l_indix++;
    l_mcc_data->m_offset_array = l_mct_offset_data;
    ++p_tcp->m_nb_mcc_records;

    return OPJ_TRUE;
}